

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstspolicy.cpp
# Opt level: O2

void __thiscall QHstsPolicy::setIncludesSubDomains(QHstsPolicy *this,bool include)

{
  QHstsPolicyPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QHstsPolicyPrivate>::operator->(&this->d);
  pQVar1->includeSubDomains = include;
  return;
}

Assistant:

void QHstsPolicy::setIncludesSubDomains(bool include)
{
    d->includeSubDomains = include;
}